

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,REF_INT node)

{
  uint cell;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_CELL *ppRVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  REF_DBL volume;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [30];
  
  ppRVar4 = ref_grid->cell + 3;
  if (ref_grid->twod == 0) {
    ppRVar4 = ref_grid->cell + 8;
  }
  uVar3 = 0;
  if (-1 < node) {
    ref_cell = *ppRVar4;
    pRVar1 = ref_cell->ref_adj;
    if ((node < pRVar1->nnode) && (lVar7 = (long)pRVar1->first[(uint)node], lVar7 != -1)) {
      ref_node = ref_grid->node;
      cell = pRVar1->item[lVar7].ref;
      uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      while (uVar3 == 0) {
        if (ref_grid->twod == 0) {
          uVar3 = ref_node_tet_vol(ref_node,local_a8,&local_b0);
          if (uVar3 != 0) {
            pcVar6 = "vol";
            uVar5 = 0x1c1;
            goto LAB_001fc5ca;
          }
        }
        else {
          uVar3 = ref_node_tri_area(ref_node,local_a8,&local_b0);
          if (uVar3 != 0) {
            pcVar6 = "area";
            uVar5 = 0x1bf;
LAB_001fc5ca:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,uVar5,"ref_validation_cell_volume_at_node",(ulong)uVar3,pcVar6);
            return uVar3;
          }
        }
        if (local_b0 <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1c8,"ref_validation_cell_volume_at_node","negative volume tet");
          printf("cell %d volume %e\n",local_b0,(ulong)cell);
          if (ref_cell->node_per < 1) {
            return 1;
          }
          lVar7 = 0;
          do {
            ref_node_location(ref_node,local_a8[lVar7]);
            lVar7 = lVar7 + 1;
          } while (lVar7 < ref_cell->node_per);
          return 1;
        }
        pRVar2 = ref_cell->ref_adj->item;
        lVar7 = (long)pRVar2[(int)lVar7].next;
        if (lVar7 == -1) {
          return 0;
        }
        cell = pRVar2[lVar7].ref;
        uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x1bd,"ref_validation_cell_volume_at_node",(ulong)uVar3,"nodes");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,
                                                      REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}